

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNameFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodeSetPtr pxVar1;
  xmlNodePtr val;
  xmlXPathObjectPtr pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlChar *pxVar4;
  int code;
  xmlChar *pxVar5;
  
  if (nargs == 0) {
    pxVar2 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar2);
    nargs = 1;
  }
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    code = 0xc;
LAB_001c4524:
    xmlXPathErr(ctxt,code);
    return;
  }
  if (ctxt->valueNr < 1) {
    code = 0x17;
    goto LAB_001c4524;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((ctxt->value->type | XPATH_USERS) != XPATH_XSLT_TREE)) {
    code = 0xb;
    goto LAB_001c4524;
  }
  pxVar2 = xmlXPathValuePop(ctxt);
  pxVar1 = pxVar2->nodesetval;
  if ((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr == 0)) {
LAB_001c44d7:
    pxVar5 = "";
LAB_001c44de:
    pxVar3 = xmlXPathCacheNewString(ctxt,pxVar5);
  }
  else {
    val = *pxVar1->nodeTab;
    if (1 < val->type - XML_ELEMENT_NODE) {
      pxVar3 = xmlXPathCacheNewNodeSet(ctxt,val);
      xmlXPathValuePush(ctxt,pxVar3);
      xmlXPathLocalNameFunction(ctxt,1);
      goto LAB_001c44f1;
    }
    pxVar5 = val->name;
    if (*pxVar5 == ' ') goto LAB_001c44d7;
    if ((val->ns == (xmlNs *)0x0) || (pxVar4 = val->ns->prefix, pxVar4 == (xmlChar *)0x0))
    goto LAB_001c44de;
    pxVar4 = xmlBuildQName(pxVar5,pxVar4,(xmlChar *)0x0,0);
    pxVar5 = (*pxVar2->nodesetval->nodeTab)->name;
    if (pxVar4 == pxVar5) {
      pxVar4 = xmlStrdup(pxVar5);
    }
    if (pxVar4 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
    }
    pxVar3 = xmlXPathCacheWrapString(ctxt,pxVar4);
  }
  xmlXPathValuePush(ctxt,pxVar3);
LAB_001c44f1:
  xmlXPathReleaseObject(ctxt->context,pxVar2);
  return;
}

Assistant:

static void
xmlXPathNameFunction(xmlXPathParserContextPtr ctxt, int nargs)
{
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
        nargs = 1;
    }

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
        ((ctxt->value->type != XPATH_NODESET) &&
         (ctxt->value->type != XPATH_XSLT_TREE)))
        XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
        xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
        int i = 0;              /* Should be first in document order !!!!! */

        switch (cur->nodesetval->nodeTab[i]->type) {
            case XML_ELEMENT_NODE:
            case XML_ATTRIBUTE_NODE:
		if (cur->nodesetval->nodeTab[i]->name[0] == ' ')
		    xmlXPathValuePush(ctxt,
			xmlXPathCacheNewCString(ctxt, ""));
		else if ((cur->nodesetval->nodeTab[i]->ns == NULL) ||
                         (cur->nodesetval->nodeTab[i]->ns->prefix == NULL)) {
		    xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			    cur->nodesetval->nodeTab[i]->name));
		} else {
		    xmlChar *fullname;

		    fullname = xmlBuildQName(cur->nodesetval->nodeTab[i]->name,
				     cur->nodesetval->nodeTab[i]->ns->prefix,
				     NULL, 0);
		    if (fullname == cur->nodesetval->nodeTab[i]->name)
			fullname = xmlStrdup(cur->nodesetval->nodeTab[i]->name);
		    if (fullname == NULL)
                        xmlXPathPErrMemory(ctxt);
		    xmlXPathValuePush(ctxt, xmlXPathCacheWrapString(ctxt, fullname));
                }
                break;
            default:
		xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt,
		    cur->nodesetval->nodeTab[i]));
                xmlXPathLocalNameFunction(ctxt, 1);
        }
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}